

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# psobjs.c
# Opt level: O3

FT_Int ps_parser_to_coord_array(PS_Parser parser,FT_Int max_coords,FT_Short *coords)

{
  byte *limit;
  byte bVar1;
  bool bVar2;
  byte bVar3;
  ulong uVar4;
  FT_Fixed FVar5;
  long lVar6;
  byte *pbVar7;
  byte *local_40;
  long local_38;
  
  skip_spaces(&parser->cursor,parser->limit);
  limit = parser->limit;
  local_40 = parser->cursor;
  lVar6 = 0;
  if (limit <= local_40) goto LAB_0022c638;
  if (*local_40 == 0x5b) {
    bVar1 = 0x5d;
LAB_0022c544:
    local_40 = local_40 + 1;
    bVar2 = false;
  }
  else {
    if (*local_40 == 0x7b) {
      bVar1 = 0x7d;
      goto LAB_0022c544;
    }
    bVar1 = 0;
    bVar2 = true;
  }
  local_38 = (long)max_coords;
  lVar6 = 0;
  do {
    if (limit <= local_40) break;
    do {
      uVar4 = (ulong)*local_40;
      pbVar7 = local_40;
      if (0x25 < uVar4) break;
      if ((0x100003601U >> (uVar4 & 0x3f) & 1) == 0) {
        if (uVar4 != 0x25) break;
        bVar3 = 0x25;
        while (((pbVar7 = local_40 + 1, bVar3 != 10 && (bVar3 != 0xd)) &&
               (local_40 = limit, pbVar7 != limit))) {
          bVar3 = *pbVar7;
          local_40 = pbVar7;
        }
      }
      local_40 = local_40 + 1;
      pbVar7 = local_40;
    } while (local_40 < limit);
    local_40 = pbVar7;
    if (limit <= pbVar7) break;
    if (bVar1 == *pbVar7) {
      local_40 = pbVar7 + 1;
      break;
    }
    if (local_38 <= lVar6 && coords != (FT_Short *)0x0) break;
    FVar5 = PS_Conv_ToFixed(&local_40,limit,0);
    if (coords != (FT_Short *)0x0) {
      coords[lVar6] = (FT_Short)((ulong)FVar5 >> 0x10);
    }
    if (pbVar7 == local_40) {
      lVar6 = 0xffffffff;
      break;
    }
    lVar6 = lVar6 + 1;
  } while (!bVar2);
LAB_0022c638:
  parser->cursor = local_40;
  return (FT_Int)lVar6;
}

Assistant:

FT_LOCAL_DEF( FT_Int )
  ps_parser_to_coord_array( PS_Parser  parser,
                            FT_Int     max_coords,
                            FT_Short*  coords )
  {
    ps_parser_skip_spaces( parser );
    return ps_tocoordarray( &parser->cursor, parser->limit,
                            max_coords, coords );
  }